

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  int vflag;
  
  bVar4 = (byte)bit;
  secp256k1_scalar_verify(r);
  if (bit < 0x100) {
    uVar6 = flag - 1U & 0x100 | bit;
    uVar8 = uVar6 >> 6;
    uVar5 = (ulong)(uVar6 < 0x40) << (bVar4 & 0x3f);
    uVar9 = (ulong)(uVar8 == 1) << (bVar4 & 0x3f);
    uVar10 = (ulong)(uVar8 == 2) << (bVar4 & 0x3f);
    uVar11 = (ulong)(uVar8 == 3) << (bVar4 & 0x3f);
    uVar2 = r->d[0];
    r->d[0] = r->d[0] + uVar5;
    puVar1 = r->d + 1;
    uVar5 = (ulong)CARRY8(uVar2,uVar5);
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar9;
    *puVar1 = uVar3 + uVar5;
    puVar1 = r->d + 2;
    uVar5 = (ulong)(CARRY8(uVar2,uVar9) || CARRY8(uVar3,uVar5));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar10;
    *puVar1 = uVar3 + uVar5;
    puVar1 = r->d + 3;
    uVar5 = (ulong)(CARRY8(uVar2,uVar10) || CARRY8(uVar3,uVar5));
    uVar2 = *puVar1;
    uVar3 = *puVar1 + uVar11;
    *puVar1 = uVar3 + uVar5;
    secp256k1_scalar_verify(r);
    if (!CARRY8(uVar2,uVar11) && !CARRY8(uVar3,uVar5)) {
      return;
    }
    pcVar12 = "test condition failed: secp256k1_u128_hi_u64(&t) == 0";
    uVar7 = 0x8d;
  }
  else {
    pcVar12 = "test condition failed: bit < 256";
    uVar7 = 0x7c;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/scalar_4x64_impl.h"
          ,uVar7,pcVar12);
  abort();
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(bit < 256);

    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
}